

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* readlines(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *__return_storage_ptr__,string *filename)

{
  ostream *poVar1;
  string line;
  fstream in;
  int aiStack_208 [124];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::fstream::fstream(&in);
  std::fstream::open((string *)&in,(_Ios_Openmode)filename);
  if (*(int *)((long)aiStack_208 + *(long *)(_in + -0x18)) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&in,(string *)&line);
    while (*(int *)((long)aiStack_208 + *(long *)(_in + -0x18)) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&line);
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&in,(string *)&line)
      ;
    }
    std::__cxx11::string::~string((string *)&line);
    std::fstream::~fstream(&in);
    return __return_storage_ptr__;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"File could not be opened.");
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(1);
}

Assistant:

std::vector<std::string> readlines(const std::string filename)
{
    std::vector<std::string> lines;
    std::fstream in;
    in.open(filename);
    if (in.rdstate() != std::ios_base::goodbit) {
        std::cout << "File could not be opened." << std::endl;
        exit(1);
    }
    std::string line;
    std::getline(in, line);
    while (in.rdstate() == std::ios_base::goodbit) {
        lines.push_back(line);
        std::getline(in, line);
    }
    return lines;
}